

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

Fraction __thiscall Matrix::GetCubicNorm(Matrix *this)

{
  bool bVar1;
  long lVar2;
  Fraction *pFVar3;
  double extraout_XMM0_Qa;
  double __x;
  double extraout_XMM0_Qa_00;
  Fraction result;
  Fraction sum;
  long local_50;
  Fraction local_48;
  Fraction local_40;
  Fraction local_38;
  
  Fraction::Fraction(&local_48);
  if (0 < this->m_) {
    local_50 = 0;
    do {
      Fraction::Fraction(&local_38,0);
      if (0 < this->n_) {
        lVar2 = 0;
        __x = extraout_XMM0_Qa;
        do {
          fabs(__x);
          Fraction::operator+=(&local_38,&local_40);
          lVar2 = lVar2 + 1;
          __x = extraout_XMM0_Qa_00;
        } while (lVar2 < this->n_);
      }
      bVar1 = operator<(&local_48,&local_38);
      pFVar3 = &local_48;
      if (bVar1) {
        pFVar3 = &local_38;
      }
      local_48 = *pFVar3;
      local_50 = local_50 + 1;
    } while (local_50 < this->m_);
  }
  return local_48;
}

Assistant:

Fraction Matrix::GetCubicNorm() const {
    Fraction result;
    for (int row = 0; row < m_; ++row) {
        Fraction sum = 0;
        for (int column = 0; column < n_; ++column) {
            sum += fabs(elements_[row][column]);
        }
        result = std::max(result, sum);
    }

    return result;
}